

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEnableTestingCommand.cxx
# Opt level: O2

bool __thiscall
cmEnableTestingCommand::InitialPass
          (cmEnableTestingCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  allocator local_31;
  string local_30;
  
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  cmMakefile::AddDefinition(this_00,&local_30,"1");
  std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

bool cmEnableTestingCommand::InitialPass(std::vector<std::string> const&,
                                         cmExecutionStatus &)
{
  this->Makefile->AddDefinition("CMAKE_TESTING_ENABLED","1");
  return true;
}